

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall luna::SemanticAnalysisVisitor::DeleteCurrentFunction(SemanticAnalysisVisitor *this)

{
  LexicalFunction *pLVar1;
  
  if (this->current_function_ != (LexicalFunction *)0x0) {
    DeleteBlocks(this);
    pLVar1 = this->current_function_;
    this->current_function_ = pLVar1->parent_;
    operator_delete(pLVar1);
    return;
  }
  __assert_fail("current_function_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                ,0xb3,"void luna::SemanticAnalysisVisitor::DeleteCurrentFunction()");
}

Assistant:

void DeleteCurrentFunction()
        {
            assert(current_function_);
            // delete all blocks in current function
            DeleteBlocks();

            // delete current function
            auto function = current_function_;
            current_function_ = function->parent_;
            delete function;
        }